

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O1

uint64_t read_leb128(uchar **data,int *b)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  uint uVar4;
  byte *pbVar5;
  
  uVar3 = 0;
  uVar4 = 0;
  pbVar5 = *data;
  do {
    if (0x3f < uVar4) {
      __assert_fail("bit < sizeof(uint64_t) * 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dwarf_eh.h"
                    ,0x68,"uint64_t read_leb128(unsigned char **, int *)");
    }
    bVar1 = *pbVar5;
    uVar3 = uVar3 + (long)(int)((bVar1 & 0x7f) << ((byte)uVar4 & 0x1f));
    uVar4 = uVar4 + 7;
    *data = pbVar5 + 1;
    bVar2 = *pbVar5;
    pbVar5 = pbVar5 + 1;
  } while (bVar2 != (byte)(bVar1 & 0x7f));
  *b = uVar4;
  return uVar3;
}

Assistant:

static uint64_t read_leb128(unsigned char** data, int *b)
{
	uint64_t uleb = 0;
	unsigned int bit = 0;
	unsigned char digit = 0;
	// We have to read at least one octet, and keep reading until we get to one
	// with the high bit unset
	do
	{
		// This check is a bit too strict - we should also check the highest
		// bit of the digit.
		assert(bit < sizeof(uint64_t) * 8);
		// Get the base 128 digit 
		digit = (**data) & 0x7f;
		// Add it to the current value
		uleb += digit << bit;
		// Increase the shift value
		bit += 7;
		// Proceed to the next octet
		(*data)++;
		// Terminate when we reach a value that does not have the high bit set
		// (i.e. which was not modified when we mask it with 0x7f)
	} while ((*(*data - 1)) != digit);
	*b = bit;

	return uleb;
}